

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalNinjaGenerator::WriteTargetCleanAdditional(cmGlobalNinjaGenerator *this,ostream *os)

{
  cmLocalGenerator *this_00;
  int iVar1;
  reference pvVar2;
  string *psVar3;
  iterator iVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  mapped_type *pmVar7;
  bool bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  pointer __k;
  pointer pbVar9;
  undefined8 in_R8;
  _Rb_tree_header *p_Var10;
  string_view str;
  string_view source;
  string local_3e0;
  reference local_3c0;
  ostream *local_3b8;
  key_type *local_3b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string local_390;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
  *local_370;
  _Base_ptr local_368;
  key_type *local_360;
  string local_358;
  string local_338;
  string cleanScriptAbs;
  string cleanScriptRel;
  string local_2d8;
  string local_2b8;
  cmGeneratedFileStream fout;
  
  local_3b8 = os;
  pvVar2 = std::
           vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ::at(&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cleanScriptRel,"CMakeFiles/clean_additional.cmake",(allocator<char> *)&fout)
  ;
  local_3c0 = pvVar2;
  psVar3 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                     ((pvVar2->_M_t).
                      super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                      .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
  fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_1_ =
       0x2f;
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&>
            (&cleanScriptAbs,psVar3,(char *)&fout,&cleanScriptRel);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            (&configs,(cmMakefile *)
                      (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
                        super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t,
             IncludeEmptyConfig);
  pbVar9 = configs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  p_Var10 = &(this->Configs)._M_t._M_impl.super__Rb_tree_header;
  __k = configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__k == pbVar9) {
      cmsys::SystemTools::RemoveFile(&cleanScriptAbs);
LAB_00265d06:
      bVar8 = false;
LAB_00265d08:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&configs);
      std::__cxx11::string::~string((string *)&cleanScriptAbs);
      std::__cxx11::string::~string((string *)&cleanScriptRel);
      return bVar8;
    }
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
            ::find(&(this->Configs)._M_t,__k);
    if (((_Rb_tree_header *)iVar4._M_node != p_Var10) &&
       (iVar4._M_node[3]._M_parent != (_Base_ptr)0x0)) {
      cmGeneratedFileStream::cmGeneratedFileStream(&fout,&cleanScriptAbs,false,None);
      if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
           [*(long *)(CONCAT71(fout.super_ofstream.
                               super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream._1_7_,
                               fout.super_ofstream.
                               super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream._0_1_) + -0x18)] & 5) == 0) {
        local_368 = &p_Var10->_M_header;
        std::operator<<((ostream *)&fout,
                        "# Additional clean files\ncmake_minimum_required(VERSION 3.16)\n");
        local_360 = configs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        pbVar9 = configs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_370 = &this->Configs;
        while (pbVar9 != local_360) {
          local_3b0 = pbVar9;
          iVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
                  ::find(&local_370->_M_t,pbVar9);
          if ((iVar4._M_node != local_368) && (iVar4._M_node[3]._M_parent != (_Base_ptr)0x0)) {
            poVar5 = std::operator<<((ostream *)&fout,
                                     "\nif(\"${CONFIG}\" STREQUAL \"\" OR \"${CONFIG}\" STREQUAL \""
                                    );
            poVar5 = std::operator<<(poVar5,(string *)local_3b0);
            std::operator<<(poVar5,"\")\n");
            std::operator<<((ostream *)&fout,"  file(REMOVE_RECURSE\n");
            for (p_Var6 = iVar4._M_node[2]._M_right;
                p_Var6 != (_Base_ptr)&iVar4._M_node[2]._M_parent;
                p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
              poVar5 = std::operator<<((ostream *)&fout,"  ");
              psVar3 = ConvertToNinjaPath(this,(string *)(p_Var6 + 1));
              str._M_str = (char *)0x0;
              str._M_len = (size_t)(psVar3->_M_dataplus)._M_p;
              cmOutputConverter::EscapeForCMake_abi_cxx11_
                        (&local_3e0,(cmOutputConverter *)psVar3->_M_string_length,str,
                         (WrapQuotes)in_R8);
              poVar5 = std::operator<<(poVar5,(string *)&local_3e0);
              std::operator<<(poVar5,'\n');
              std::__cxx11::string::~string((string *)&local_3e0);
            }
            std::operator<<((ostream *)&fout,"  )\n");
            std::operator<<((ostream *)&fout,"endif()\n");
          }
          pbVar9 = local_3b0 + 1;
        }
        cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&((local_3c0->_M_t).
                      super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                      .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile->
                     OutputFiles,&cleanScriptAbs);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b8,"CLEAN_ADDITIONAL",(allocator<char> *)&local_3e0);
        cmNinjaRule::cmNinjaRule((cmNinjaRule *)&fout,&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        CMakeCmd_abi_cxx11_(&local_390,this);
        this_00 = (local_3c0->_M_t).
                  super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                  .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
        NinjaOutputPath(&local_338,this,&cleanScriptRel);
        source._M_str = local_338._M_dataplus._M_p;
        source._M_len = local_338._M_string_length;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  (&local_358,&this_00->super_cmOutputConverter,source,SHELL,false);
        cmStrCat<std::__cxx11::string,char_const(&)[22],std::__cxx11::string>
                  (&local_3e0,&local_390,(char (*) [22])" -DCONFIG=$CONFIG -P ",&local_358);
        std::__cxx11::string::operator=
                  ((string *)
                   &fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    field_0x20,(string *)&local_3e0);
        std::__cxx11::string::~string((string *)&local_3e0);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::assign
                  (&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    field_0x40);
        std::__cxx11::string::assign
                  (&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    field_0x60);
        WriteRule((ostream *)
                  (this->RulesFileStream)._M_t.
                  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                  .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                  (cmNinjaRule *)&fout);
        cmNinjaRule::~cmNinjaRule((cmNinjaRule *)&fout);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d8,"CLEAN_ADDITIONAL",(allocator<char> *)&local_3e0);
        cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)&fout,&local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::assign((char *)&fout);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                             field_0x40);
        for (pbVar9 = configs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar9 != configs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_358,"CMakeFiles/clean.additional",
                     (allocator<char> *)&local_338);
          NinjaOutputPath(&local_390,this,&local_358);
          (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x4c])(&local_3e0,this,&local_390);
          std::__cxx11::string::operator=
                    ((string *)
                     fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._64_8_,
                     (string *)&local_3e0);
          std::__cxx11::string::~string((string *)&local_3e0);
          std::__cxx11::string::~string((string *)&local_390);
          std::__cxx11::string::~string((string *)&local_358);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3e0,"CONFIG",(allocator<char> *)&local_390);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&fout.super_ofstream.
                                    super_basic_ostream<char,_std::char_traits<char>_>.field_0xd0,
                                &local_3e0);
          std::__cxx11::string::_M_assign((string *)pmVar7);
          std::__cxx11::string::~string((string *)&local_3e0);
          WriteBuild(this,local_3b8,(cmNinjaBuild *)&fout,0,(bool *)0x0);
        }
        iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[0x28])();
        if ((char)iVar1 != '\0') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_390,"CMakeFiles/clean.additional",
                     (allocator<char> *)&local_358);
          NinjaOutputPath(&local_3e0,this,&local_390);
          std::__cxx11::string::operator=
                    ((string *)
                     fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._64_8_,
                     (string *)&local_3e0);
          std::__cxx11::string::~string((string *)&local_3e0);
          std::__cxx11::string::~string((string *)&local_390);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3e0,"CONFIG",(allocator<char> *)&local_390);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&fout.super_ofstream.
                                    super_basic_ostream<char,_std::char_traits<char>_>.field_0xd0,
                                &local_3e0);
          std::__cxx11::string::assign((char *)pmVar7);
          std::__cxx11::string::~string((string *)&local_3e0);
          WriteBuild(this,local_3b8,(cmNinjaBuild *)&fout,0,(bool *)0x0);
        }
        cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&fout);
        bVar8 = true;
        goto LAB_00265d08;
      }
      cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
      goto LAB_00265d06;
    }
    __k = __k + 1;
  } while( true );
}

Assistant:

bool cmGlobalNinjaGenerator::WriteTargetCleanAdditional(std::ostream& os)
{
  const auto& lgr = this->LocalGenerators.at(0);
  std::string cleanScriptRel = "CMakeFiles/clean_additional.cmake";
  std::string cleanScriptAbs =
    cmStrCat(lgr->GetBinaryDirectory(), '/', cleanScriptRel);
  std::vector<std::string> configs =
    this->Makefiles[0]->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  // Check if there are additional files to clean
  bool empty = true;
  for (auto const& config : configs) {
    auto const it = this->Configs.find(config);
    if (it != this->Configs.end() &&
        !it->second.AdditionalCleanFiles.empty()) {
      empty = false;
      break;
    }
  }
  if (empty) {
    // Remove cmake clean script file if it exists
    cmSystemTools::RemoveFile(cleanScriptAbs);
    return false;
  }

  // Write cmake clean script file
  {
    cmGeneratedFileStream fout(cleanScriptAbs);
    if (!fout) {
      return false;
    }
    fout << "# Additional clean files\ncmake_minimum_required(VERSION 3.16)\n";
    for (auto const& config : configs) {
      auto const it = this->Configs.find(config);
      if (it != this->Configs.end() &&
          !it->second.AdditionalCleanFiles.empty()) {
        fout << "\nif(\"${CONFIG}\" STREQUAL \"\" OR \"${CONFIG}\" STREQUAL \""
             << config << "\")\n";
        fout << "  file(REMOVE_RECURSE\n";
        for (std::string const& acf : it->second.AdditionalCleanFiles) {
          fout << "  "
               << cmOutputConverter::EscapeForCMake(
                    this->ConvertToNinjaPath(acf))
               << '\n';
        }
        fout << "  )\n";
        fout << "endif()\n";
      }
    }
  }
  // Register clean script file
  lgr->GetMakefile()->AddCMakeOutputFile(cleanScriptAbs);

  // Write rule
  {
    cmNinjaRule rule("CLEAN_ADDITIONAL");
    rule.Command = cmStrCat(
      this->CMakeCmd(), " -DCONFIG=$CONFIG -P ",
      lgr->ConvertToOutputFormat(this->NinjaOutputPath(cleanScriptRel),
                                 cmOutputConverter::SHELL));
    rule.Description = "Cleaning additional files...";
    rule.Comment = "Rule for cleaning additional files.";
    WriteRule(*this->RulesFileStream, rule);
  }

  // Write build
  {
    cmNinjaBuild build("CLEAN_ADDITIONAL");
    build.Comment = "Clean additional files.";
    build.Outputs.emplace_back();
    for (auto const& config : configs) {
      build.Outputs.front() = this->BuildAlias(
        this->NinjaOutputPath(this->GetAdditionalCleanTargetName()), config);
      build.Variables["CONFIG"] = config;
      this->WriteBuild(os, build);
    }
    if (this->IsMultiConfig()) {
      build.Outputs.front() =
        this->NinjaOutputPath(this->GetAdditionalCleanTargetName());
      build.Variables["CONFIG"] = "";
      this->WriteBuild(os, build);
    }
  }
  // Return success
  return true;
}